

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  size_t ret;
  HUF_DecompressFastLoopFn loopFn;
  HUF_DecompressUsingDTableFn fallbackFn;
  int flags_local;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  
  if (((flags & 0x20U) != 0) ||
     (dst_local = (void *)HUF_decompress4X1_usingDTable_internal_fast
                                    (dst,dstSize,cSrc,cSrcSize,DTable,
                                     HUF_decompress4X1_usingDTable_internal_fast_c_loop),
     dst_local == (void *)0x0)) {
    dst_local = (void *)HUF_decompress4X1_usingDTable_internal_default
                                  (dst,dstSize,cSrc,cSrcSize,DTable);
  }
  return (size_t)dst_local;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}